

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolutionNeighbourhood.cpp
# Opt level: O2

void __thiscall
SolutionNeighbourhood::SolutionNeighbourhood(SolutionNeighbourhood *this,Solution *solution)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar1;
  _Base_ptr p_Var2;
  
  this->solution = solution;
  this->lastMove = (Move *)0x0;
  (this->nurseVector).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nurseVector).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nurseVector).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->phase = 0;
  this->iterator1 = 0;
  this->iterator2 = 0;
  this->iteratorTurn1 = 0;
  *(undefined8 *)((long)&this->iteratorTurn1 + 1) = 0;
  pmVar1 = Solution::getNurses_abi_cxx11_(solution);
  p_Var2 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    pmVar1 = Solution::getNurses_abi_cxx11_(solution);
    if ((_Rb_tree_header *)p_Var2 == &(pmVar1->_M_t)._M_impl.super__Rb_tree_header) break;
    std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::push_back
              (&this->nurseVector,(value_type *)(p_Var2 + 2));
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  return;
}

Assistant:

SolutionNeighbourhood::SolutionNeighbourhood(Solution* solution) : solution(solution){
    this->phase = 0;
    this->iterator1 = 0;
    this->iterator2 = 0;
    this->iteratorTurn1 = 0;
    this->iteratorTurn2 = 0;

    for(auto it = solution->getNurses().begin(); it != solution->getNurses().end(); ++it ) {
        this->nurseVector.push_back( it->second );
    }
}